

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedChangeSize::Run(AdvancedChangeSize *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  int iVar4;
  int iVar5;
  reference this_00;
  float *pixels;
  CallLogWrapper *this_01;
  Vector<float,_4> local_7c [2];
  allocator<tcu::Vector<float,_3>_> local_59;
  undefined1 local_58 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  GLuint GStack_38;
  bool status;
  int i_2;
  int i_1;
  int size [2];
  int i;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedChangeSize *this_local;
  
  glsl_fs = 
  "#version 430 core\nout gl_PerVertex { vec4 gl_Position; };\nconst vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };\nvoid main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }"
  ;
  stack0xffffffffffffffd8 =
       "#version 430 core\nlayout(location = 0) out vec4 g_color;\nlayout(binding = 0, rgba8) uniform image2D g_image[2];\nuniform ivec2 g_expected_size[2];\nuniform int g_0 = 0, g_1 = 1;\nvoid main() {\n  vec4 c = vec4(0, 1, 0, 1);\n  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);\n  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);\n  g_color = c;\n}"
  ;
  glsl_vs = (char *)this;
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b31,1,&glsl_fs);
  this->m_program[0] = GVar2;
  GVar2 = glu::CallLogWrapper::glCreateShaderProgramv
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b30,1,(GLchar **)(size + 1));
  this->m_program[1] = GVar2;
  for (size[0] = 0; size[0] < 2; size[0] = size[0] + 1) {
    bVar1 = ShaderImageSizeBase::CheckProgram
                      (&this->super_ShaderImageSizeBase,this->m_program[size[0]]);
    if (!bVar1) {
      this_local = (AdvancedChangeSize *)&DAT_ffffffffffffffff;
      return (long)this_local;
    }
  }
  glu::CallLogWrapper::glUseProgramStages
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_pipeline,1,this->m_program[0]);
  glu::CallLogWrapper::glUseProgramStages
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_pipeline,2,this->m_program[1]);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vertex_array);
  glu::CallLogWrapper::glBindProgramPipeline
            (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_pipeline);
  i_2 = 0x20;
  i_1 = 0x80;
  for (GStack_38 = 0; (int)GStack_38 < 2; GStack_38 = GStack_38 + 1) {
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[(int)GStack_38]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2800,0x2601);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8058,(&i_2)[(int)GStack_38],(&i_2)[(int)GStack_38],0,
               0x1908,0x1406,(void *)0x0);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GStack_38,this->m_texture[(int)GStack_38],0,'\0',0,35000,0x8058
              );
  }
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    if (2 < fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      return 0;
    }
    this_01 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    GVar2 = this->m_program[1];
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_01,GVar2,"g_expected_size[0]");
    glu::CallLogWrapper::glProgramUniform2i(this_01,GVar2,GVar3,i_2,i_2);
    GVar2 = this->m_program[1];
    GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_01,GVar2,"g_expected_size[1]");
    glu::CallLogWrapper::glProgramUniform2i(this_01,GVar2,GVar3,i_1,i_1);
    glu::CallLogWrapper::glClear(this_01,0x4000);
    glu::CallLogWrapper::glDrawArrays(this_01,4,0,3);
    fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    iVar4 = ShaderImageSizeBase::getWindowWidth(&this->super_ShaderImageSizeBase);
    iVar5 = ShaderImageSizeBase::getWindowHeight(&this->super_ShaderImageSizeBase);
    std::allocator<tcu::Vector<float,_3>_>::allocator(&local_59);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_58,
               (long)(iVar4 * iVar5),&local_59);
    std::allocator<tcu::Vector<float,_3>_>::~allocator(&local_59);
    iVar4 = ShaderImageSizeBase::getWindowWidth(&this->super_ShaderImageSizeBase);
    iVar5 = ShaderImageSizeBase::getWindowHeight(&this->super_ShaderImageSizeBase);
    this_00 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
              operator[]((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                         local_58,0);
    pixels = tcu::Vector<float,_3>::operator[](this_00,0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,iVar4,iVar5,0x1907,0x1406,pixels);
    iVar4 = ShaderImageSizeBase::getWindowWidth(&this->super_ShaderImageSizeBase);
    iVar5 = ShaderImageSizeBase::getWindowHeight(&this->super_ShaderImageSizeBase);
    tcu::Vector<float,_4>::Vector(local_7c,0.0,1.0,0.0,1.0);
    bVar1 = ShaderImageSizeBase::ValidateReadBuffer
                      (&this->super_ShaderImageSizeBase,0,0,iVar4,iVar5,local_7c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    }
    bVar1 = (fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0;
    if (bVar1) {
      this_local = (AdvancedChangeSize *)&DAT_ffffffffffffffff;
    }
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_58);
    if (bVar1) break;
    i_2 = i_2 / 2;
    i_1 = i_1 / 2;
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[0]);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8058,i_2,i_2,0,0x1908,0x1406,(void *)0x0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8058,i_1,i_1,0,0x1908,0x1406,(void *)0x0);
    fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 430 core" NL "out gl_PerVertex { vec4 gl_Position; };" NL
									"const vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };" NL
									"void main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }";
		const char* const glsl_fs =
			"#version 430 core" NL "layout(location = 0) out vec4 g_color;" NL
			"layout(binding = 0, rgba8) uniform image2D g_image[2];" NL "uniform ivec2 g_expected_size[2];" NL
			"uniform int g_0 = 0, g_1 = 1;" NL "void main() {" NL "  vec4 c = vec4(0, 1, 0, 1);" NL
			"  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);" NL
			"  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);" NL "  g_color = c;" NL
			"}";
		m_program[0] = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_program[1] = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		for (int i = 0; i < 2; ++i)
			if (!CheckProgram(m_program[i]))
				return ERROR;

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_program[1]);

		glBindVertexArray(m_vertex_array);
		glBindProgramPipeline(m_pipeline);

		int size[2] = { 32, 128 };
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[i], size[i], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindImageTexture(i, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8);
		}

		for (int i = 0; i < 3; ++i)
		{
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[0]"), size[0],
							   size[0]);
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[1]"), size[1],
							   size[1]);
			glClear(GL_COLOR_BUFFER_BIT);
			glDrawArrays(GL_TRIANGLES, 0, 3);

			{
				bool			  status = true;
				std::vector<vec3> fb(getWindowWidth() * getWindowHeight());
				glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
				if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
					status = false;
				if (!status)
					return ERROR;
			}

			size[0] /= 2;
			size[1] /= 2;

			glBindTexture(GL_TEXTURE_2D, m_texture[0]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[0], size[0], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindTexture(GL_TEXTURE_2D, m_texture[1]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[1], size[1], 0, GL_RGBA, GL_FLOAT, NULL);
		}
		return NO_ERROR;
	}